

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::Orphan<capnp::DynamicList>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  ListReader reader;
  ListSchema schema;
  ElementSize elementSize;
  Which elementType;
  ListReader local_50;
  undefined8 local_20;
  anon_union_8_2_eba6ea51_for_Type_5 local_18;
  Orphan<capnp::DynamicList> *local_10;
  Orphan<capnp::DynamicList> *this_local;
  
  local_20._0_2_ = (this->schema).elementType.baseType;
  local_20._2_1_ = (this->schema).elementType.listDepth;
  local_20._3_1_ = (this->schema).elementType.isImplicitParam;
  local_20._4_2_ = (this->schema).elementType.field_3;
  local_20._6_2_ = *(undefined2 *)&(this->schema).elementType.field_0x6;
  local_18 = (anon_union_8_2_eba6ea51_for_Type_5)(this->schema).elementType.field_4.schema;
  local_10 = this;
  elementType = ListSchema::whichElementType(&this->schema);
  elementSize = anon_unknown_70::elementSizeFor(elementType);
  _::OrphanBuilder::asListReader(&local_50,&this->builder,elementSize);
  schema.elementType.field_4.schema = local_18.schema;
  schema.elementType.baseType = (undefined2)local_20;
  schema.elementType.listDepth = local_20._2_1_;
  schema.elementType.isImplicitParam = (bool)local_20._3_1_;
  schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_20._4_2_;
  schema.elementType._6_2_ = local_20._6_2_;
  reader.capTable = local_50.capTable;
  reader.segment = local_50.segment;
  reader.ptr = local_50.ptr;
  reader.elementCount = local_50.elementCount;
  reader.step = local_50.step;
  reader.structDataSize = local_50.structDataSize;
  reader.structPointerCount = local_50.structPointerCount;
  reader.elementSize = local_50.elementSize;
  reader._39_1_ = local_50._39_1_;
  reader.nestingLimit = local_50.nestingLimit;
  reader._44_4_ = local_50._44_4_;
  DynamicList::Reader::Reader(__return_storage_ptr__,schema,reader);
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Reader Orphan<DynamicList>::getReader() const {
  return DynamicList::Reader(
      schema, builder.asListReader(elementSizeFor(schema.whichElementType())));
}